

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O0

void __thiscall sock_tests::move_assignment::test_method(move_assignment *this)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long in_FS_OFFSET;
  Sock *sock2;
  Sock *sock1;
  SOCKET s2;
  SOCKET s1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  assertion_result *in_stack_fffffffffffff9b8;
  assertion_result *this_00;
  lazy_ostream *in_stack_fffffffffffff9d0;
  size_t in_stack_fffffffffffff9d8;
  assertion_result *line_num;
  const_string *in_stack_fffffffffffff9e0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff9e8;
  unit_test_log_t *this_01;
  lazy_ostream local_4a0 [2];
  assertion_result local_480 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  assertion_result local_408;
  unit_test_log_t local_3f0 [2];
  const_string local_3e0;
  const_string local_3d0 [2];
  lazy_ostream local_3b0 [2];
  assertion_result local_390 [2];
  const_string local_358 [2];
  lazy_ostream local_338 [2];
  assertion_result local_318 [2];
  const_string local_2e0 [2];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  const_string local_268 [2];
  lazy_ostream local_248 [2];
  assertion_result local_228 [2];
  const_string local_1f0 [2];
  lazy_ostream local_1d0 [2];
  assertion_result local_1b0 [2];
  const_string local_178 [2];
  lazy_ostream local_158 [2];
  assertion_result local_138 [2];
  const_string local_100 [2];
  lazy_ostream local_e0 [2];
  assertion_result local_c0 [2];
  const_string local_88 [2];
  lazy_ostream local_68 [2];
  assertion_result local_48 [2];
  SOCKET local_10;
  SOCKET local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = CreateSocket();
  local_10 = CreateSocket();
  plVar2 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffff9a8,0);
  plVar3 = (long *)operator_new(0x10);
  Sock::Sock((Sock *)in_stack_fffffffffffff9a8,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_48,local_68,local_88,0x42,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c0,local_e0,local_100,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  (**(code **)(*plVar3 + 0x10))(plVar3,plVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_138,local_158,local_178,0x46,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b0,local_1d0,local_1f0,0x47,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    Sock::operator==((Sock *)in_stack_fffffffffffff9a8,0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_228,local_248,local_268,0x48,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a0,local_2c0,local_2e0,0x4b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_318,local_338,local_358,0x4c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,
               (const_string *)in_stack_fffffffffffff9d0);
    Sock::operator==((Sock *)in_stack_fffffffffffff9a8,0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_390,local_3b0,local_3d0,0x4d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  do {
    file = &local_3e0;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    this_01 = local_3f0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff9b8,(bool)in_stack_fffffffffffff9b7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_408,local_428,local_448,0x50,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,file,(size_t)line_num,(const_string *)in_stack_fffffffffffff9d0);
    SocketIsClosed((SOCKET *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_fffffffffffff9b7);
    in_stack_fffffffffffff9d0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff9a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               (unsigned_long)in_stack_fffffffffffff9a8);
    in_stack_fffffffffffff9a8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4a0,(const_string *)&stack0xfffffffffffffb40,0x51,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffff9a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(move_assignment)
{
    const SOCKET s1 = CreateSocket();
    const SOCKET s2 = CreateSocket();
    Sock* sock1 = new Sock(s1);
    Sock* sock2 = new Sock(s2);

    BOOST_CHECK(!SocketIsClosed(s1));
    BOOST_CHECK(!SocketIsClosed(s2));

    *sock2 = std::move(*sock1);
    BOOST_CHECK(!SocketIsClosed(s1));
    BOOST_CHECK(SocketIsClosed(s2));
    BOOST_CHECK(*sock2 == s1);

    delete sock1;
    BOOST_CHECK(!SocketIsClosed(s1));
    BOOST_CHECK(SocketIsClosed(s2));
    BOOST_CHECK(*sock2 == s1);

    delete sock2;
    BOOST_CHECK(SocketIsClosed(s1));
    BOOST_CHECK(SocketIsClosed(s2));
}